

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeCompositeDebugType
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *memberTypes,char *name
          ,NonSemanticShaderDebugInfo100DebugCompositeType tag,bool isOpaqueType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint value;
  iterator __position;
  Builder *this_00;
  char *__s;
  Id IVar2;
  iterator iVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *debugTypeLoc;
  Instruction *this_01;
  long *plVar5;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_02;
  size_type *psVar6;
  Id IVar7;
  pointer puVar8;
  byte bVar9;
  pointer puVar10;
  undefined3 in_register_00000081;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> memberDebugTypes;
  Instruction *type;
  uint memberType;
  allocator<char> local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  Builder *local_90;
  Instruction *local_88;
  NonSemanticShaderDebugInfo100DebugCompositeType local_80;
  undefined4 local_7c;
  string local_78;
  char *local_58;
  Id local_50;
  undefined4 uStack_4c;
  long local_40 [2];
  
  local_7c = CONCAT31(in_register_00000081,isOpaqueType);
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (Id *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (Id *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  puVar10 = (memberTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar8 = (memberTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_90 = this;
  local_80 = tag;
  local_58 = name;
  if (puVar10 != puVar8) {
    do {
      local_78._M_dataplus._M_p._0_4_ = *puVar10;
      iVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->debugTypeLocs)._M_h,(key_type_conflict *)&local_78);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("debugTypeLocs.find(memberType) != debugTypeLocs.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x418,
                      "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                     );
      }
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,(key_type_conflict *)&local_78);
      if (*pmVar4 != 0) {
        IVar2 = (uint)local_78._M_dataplus._M_p;
        debugTypeLoc = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->debugTypeLocs,(key_type *)&local_78);
        local_50 = makeMemberDebugType(local_90,IVar2,debugTypeLoc);
        if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_50;
          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar8);
  }
  this_01 = (Instruction *)operator_new(0x60);
  this_00 = local_90;
  IVar7 = local_90->uniqueId + 1;
  local_90->uniqueId = IVar7;
  IVar2 = makeVoidType(local_90);
  this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  this_01->resultId = IVar7;
  this_01->typeId = IVar2;
  this_01->opCode = OpExtInst;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_01->block = (Block *)0x0;
  __n = ((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) + 0xb;
  local_88 = this_01;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_01->operands,__n);
  std::vector<bool,_std::allocator<bool>_>::reserve(&this_01->idOperand,__n);
  Instruction::addIdOperand(this_01,this_00->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(this_01,10);
  __s = local_58;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,local_58,(allocator<char> *)&local_50);
  IVar2 = getStringId(this_00,&local_78);
  Instruction::addIdOperand(this_01,IVar2);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  IVar2 = makeIntegerType(this_00,0x20,false);
  IVar2 = makeIntConstant(this_00,IVar2,local_80,false);
  Instruction::addIdOperand(this_01,IVar2);
  IVar2 = makeDebugSource(this_00,this_00->currentFileId);
  Instruction::addIdOperand(this_01,IVar2);
  value = this_00->currentLine;
  IVar2 = makeIntegerType(this_00,0x20,false);
  IVar2 = makeIntConstant(this_00,IVar2,value,false);
  Instruction::addIdOperand(this_01,IVar2);
  IVar2 = makeIntegerType(this_00,0x20,false);
  IVar2 = makeIntConstant(this_00,IVar2,0,false);
  Instruction::addIdOperand(this_01,IVar2);
  IVar2 = makeDebugCompilationUnit(this_00);
  Instruction::addIdOperand(this_01,IVar2);
  bVar9 = (byte)local_7c;
  if (bVar9 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,__s,(allocator<char> *)&local_50);
    IVar2 = getStringId(this_00,&local_78);
    Instruction::addIdOperand(this_01,IVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    IVar2 = makeIntegerType(this_00,0x20,false);
    IVar2 = makeIntConstant(this_00,IVar2,0,false);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_a9);
    plVar5 = (long *)std::__cxx11::string::insert((ulong)&local_50,0,'\x01');
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    IVar2 = getStringId(this_00,&local_78);
    Instruction::addIdOperand(this_01,IVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(uStack_4c,local_50) != local_40) {
      operator_delete((long *)CONCAT44(uStack_4c,local_50),local_40[0] + 1);
    }
    IVar2 = makeDebugInfoNone(this_00);
  }
  Instruction::addIdOperand(this_01,IVar2);
  IVar2 = makeIntegerType(this_00,0x20,false);
  IVar2 = makeIntConstant(this_00,IVar2,3,false);
  Instruction::addIdOperand(this_01,IVar2);
  puVar10 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar8 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((bVar9 & local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish) == 1) {
    __assert_fail("isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty())",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x437,
                  "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                 );
  }
  for (; puVar8 != puVar10; puVar8 = puVar8 + 1) {
    Instruction::addIdOperand(this_01,*puVar8);
  }
  local_78._M_dataplus._M_p._0_4_ = 10;
  this_02 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this_00->groupedDebugTypes,(key_type *)&local_78);
  __position._M_current = *(Instruction ***)(this_02 + 8);
  if (__position._M_current == *(Instruction ***)(this_02 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_02,__position,&local_88);
    local_78._M_dataplus._M_p = (pointer)local_88;
  }
  else {
    *__position._M_current = this_01;
    *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
    local_78._M_dataplus._M_p = (pointer)this_01;
  }
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this_00->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_78);
  if ((Instruction *)local_78._M_dataplus._M_p != (Instruction *)0x0) {
    (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
  }
  Module::mapInstruction(&this_00->module,local_88);
  IVar2 = local_88->resultId;
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (Id *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar2;
}

Assistant:

Id Builder::makeCompositeDebugType(std::vector<Id> const& memberTypes, char const*const name,
    NonSemanticShaderDebugInfo100DebugCompositeType const tag, bool const isOpaqueType)
{
    // Create the debug member types.
    std::vector<Id> memberDebugTypes;
    for(auto const memberType : memberTypes) {
        assert(debugTypeLocs.find(memberType) != debugTypeLocs.end());

        // There _should_ be debug types for all the member types but currently buffer references
        // do not have member debug info generated.
        if (debugId[memberType])
            memberDebugTypes.emplace_back(makeMemberDebugType(memberType, debugTypeLocs[memberType]));

        // TODO: Need to rethink this method of passing location information.
        // debugTypeLocs.erase(memberType);
    }

    // Create The structure debug type.
    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(memberDebugTypes.size() + 11);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeComposite);
    type->addIdOperand(getStringId(name)); // name id
    type->addIdOperand(makeUintConstant(tag)); // tag id
    type->addIdOperand(makeDebugSource(currentFileId)); // source id
    type->addIdOperand(makeUintConstant(currentLine)); // line id TODO: currentLine always zero?
    type->addIdOperand(makeUintConstant(0)); // TODO: column id
    type->addIdOperand(makeDebugCompilationUnit()); // scope id
    if(isOpaqueType == true) {
        // Prepend '@' to opaque types.
        type->addIdOperand(getStringId('@' + std::string(name))); // linkage name id
        type->addIdOperand(makeDebugInfoNone()); // size id
    } else {
        type->addIdOperand(getStringId(name)); // linkage name id
        type->addIdOperand(makeUintConstant(0)); // TODO: size id
    }
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic)); // flags id
    assert(isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty()));
    for(auto const memberDebugType : memberDebugTypes) {
        type->addIdOperand(memberDebugType);
    }

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeComposite].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}